

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_CCtxParams_reset(ZSTD_CCtx_params *params)

{
  if (params != (ZSTD_CCtx_params *)0x0) {
    (params->fParams).contentSizeFlag = 0;
    (params->fParams).checksumFlag = 0;
    *(undefined8 *)&(params->fParams).noDictIDFlag = 0;
    (params->customMem).customFree = (ZSTD_freeFunction)0x0;
    (params->customMem).opaque = (void *)0x0;
    (params->ldmParams).hashRateLog = 0;
    (params->ldmParams).windowLog = 0;
    (params->customMem).customAlloc = (ZSTD_allocFunction)0x0;
    (params->ldmParams).enableLdm = 0;
    (params->ldmParams).hashLog = 0;
    (params->ldmParams).bucketSizeLog = 0;
    (params->ldmParams).minMatchLength = 0;
    params->jobSize = 0;
    params->overlapLog = 0;
    params->rsyncable = 0;
    params->forceWindow = 0;
    params->attachDictPref = ZSTD_dictDefaultAttach;
    *(undefined8 *)&params->nbWorkers = 0;
    (params->cParams).searchLog = 0;
    (params->cParams).minMatch = 0;
    (params->cParams).targetLength = 0;
    (params->cParams).strategy = 0;
    params->format = ZSTD_f_zstd1;
    (params->cParams).windowLog = 0;
    (params->cParams).chainLog = 0;
    (params->cParams).hashLog = 0;
    params->compressionLevel = 3;
    (params->fParams).contentSizeFlag = 1;
    return 0;
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t ZSTD_CCtxParams_init(ZSTD_CCtx_params* cctxParams, int compressionLevel) {
    if (!cctxParams) { return ERROR(GENERIC); }
    memset(cctxParams, 0, sizeof(*cctxParams));
    cctxParams->compressionLevel = compressionLevel;
    cctxParams->fParams.contentSizeFlag = 1;
    return 0;
}